

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t
flatcc_builder_create_struct(flatcc_builder_t *B,void *data,size_t size,uint16_t align)

{
  flatcc_builder_ref_t fVar1;
  ulong uVar2;
  undefined6 in_register_0000000a;
  bool bVar3;
  flatcc_iov_state_t iov;
  
  if ((int)CONCAT62(in_register_0000000a,align) == 0) {
    __assert_fail("align >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x31e,
                  "flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *, const void *, size_t, uint16_t)"
                 );
  }
  if (B->min_align < align) {
    B->min_align = align;
  }
  uVar2 = (ulong)(align - 1 & B->emit_start - (int)size);
  iov.len = 0;
  bVar3 = size != 0;
  if (bVar3) {
    iov.len = size;
    iov.iov[0].iov_base = data;
    iov.iov[0].iov_len = size;
  }
  iov.count = (int)bVar3;
  if (uVar2 != 0) {
    iov.len = size + uVar2;
    iov.iov[bVar3].iov_base = "";
    iov.iov[bVar3].iov_len = uVar2;
    iov.count = bVar3 + 1;
  }
  fVar1 = emit_front(B,&iov);
  return fVar1;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *B, const void *data, size_t size, uint16_t align)
{
    size_t pad;
    iov_state_t iov;

    check(align >= 1, "align cannot be 0");
    set_min_align(B, align);
    pad = front_pad(B, (uoffset_t)size, align);
    init_iov();
    push_iov(data, size);
    /*
     * Normally structs will already be a multiple of their alignment,
     * so this padding will not likely be emitted.
     */
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}